

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::generateScene(Map *this)

{
  uint uVar1;
  Scene *this_00;
  Decorator *pDVar2;
  Scene *local_20;
  
  std::operator<<((ostream *)&std::cout,"class:Map method:generateScene\n");
  uVar1 = rand();
  if ((uVar1 & 1) == 0) {
    this_00 = (Scene *)operator_new(0x60);
    pDVar2 = (Decorator *)operator_new(8);
    pDVar2->_vptr_Decorator = (_func_int **)&PTR__Decorator_00117658;
    Pasture::Pasture((Pasture *)this_00,pDVar2);
  }
  else {
    this_00 = (Scene *)operator_new(0x60);
    pDVar2 = (Decorator *)operator_new(8);
    pDVar2->_vptr_Decorator = (_func_int **)&PTR__Decorator_00117658;
    Farm::Farm((Farm *)this_00,pDVar2);
  }
  local_20 = this_00;
  std::vector<Scene*,std::allocator<Scene*>>::emplace_back<Scene*>
            ((vector<Scene*,std::allocator<Scene*>> *)this,&local_20);
  return;
}

Assistant:

void Map::generateScene(void) {
    std::cout << "class:Map method:generateScene\n";
    if (rand() % 2) {
        scenes.push_back(new Farm);
    } else {
        scenes.push_back(new Pasture);
    }
}